

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance
          (CopiesAndBlittingTestInstance *this,Context *context,TestParams *testParams)

{
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar1;
  pointer __src;
  VkCommandPool obj;
  VkCommandBuffer_s *pVVar2;
  DeviceInterface *pDVar3;
  VkFence obj_00;
  undefined8 uVar4;
  undefined8 uVar5;
  VkDeviceSize VVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  deUint32 queueFamilyIndex;
  pointer __dest;
  DeviceInterface *vk;
  VkDevice device;
  long lVar9;
  size_t __n;
  Move<vk::Handle<(vk::HandleType)24>_> local_88;
  Move<vk::VkCommandBuffer_s_*> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  VkCommandBuffer_s *local_38;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__CopiesAndBlittingTestInstance_00d1f0d0;
  uVar4 = *(undefined8 *)((long)&testParams->src + 8);
  uVar5 = *(undefined8 *)((long)&testParams->src + 0x10);
  VVar6 = (testParams->dst).buffer.size;
  uVar7 = *(undefined8 *)((long)&testParams->dst + 8);
  uVar8 = *(undefined8 *)((long)&testParams->dst + 0x10);
  (this->m_params).src.buffer.size = (testParams->src).buffer.size;
  *(undefined8 *)((long)&(this->m_params).src + 8) = uVar4;
  *(undefined8 *)((long)&(this->m_params).src + 0x10) = uVar5;
  (this->m_params).dst.buffer.size = VVar6;
  *(undefined8 *)((long)&(this->m_params).dst + 8) = uVar7;
  *(undefined8 *)((long)&(this->m_params).dst + 0x10) = uVar8;
  lVar9 = (long)(testParams->regions).
                super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(testParams->regions).
                super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dest = std::
           _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
           ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                          *)((lVar9 >> 4) * -0x3333333333333333),(size_t)context);
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = __dest;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = __dest;
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar9 + (long)__dest);
  __src = (testParams->regions).
          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(testParams->regions).
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->m_params).regions.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n);
  (this->m_params).field_3 = testParams->field_3;
  pMVar1 = &this->m_cmdPool;
  local_60 = &this->m_cmdBuffer;
  (this->m_destinationTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  (this->m_expectedTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_sourceTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool(&local_88,vk,device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_48 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  uStack_40 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_58 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  uStack_50 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,obj)
    ;
  }
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_48;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       uStack_40;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal = local_58;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       uStack_50;
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_88,vk,device,
             (VkCommandPool)
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_48._0_4_ =
       SUB84(local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,0);
  local_48._4_4_ =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device._4_4_;
  uStack_40._0_4_ =
       SUB84(local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,0);
  uStack_40._4_4_ =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_;
  local_58 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  uStack_50 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pVVar2 = (local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
  if (pVVar2 != (VkCommandBuffer_s *)0x0) {
    pDVar3 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    local_38 = pVVar2;
    (*pDVar3->_vptr_DeviceInterface[0x48])
              (pDVar3,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal);
  }
  *(undefined4 *)&(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device =
       (undefined4)local_48;
  *(undefined4 *)
   ((long)&(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device + 4) =
       local_48._4_4_;
  *(undefined4 *)
   &(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal =
       (undefined4)uStack_40;
  *(undefined4 *)
   ((long)&(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal + 4)
       = uStack_40._4_4_;
  *(undefined4 *)&(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
       (undefined4)local_58;
  *(undefined4 *)((long)&(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object + 4) =
       local_58._4_4_;
  *(undefined4 *)&(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface =
       (undefined4)uStack_50;
  *(undefined4 *)
   ((long)&(local_60->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface + 4) =
       uStack_50._4_4_;
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    local_58 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    (*(local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface,
               local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  }
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_88,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_48 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  uStack_40 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_58 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  uStack_50 = local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,obj_00)
    ;
  }
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = local_48;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       uStack_40;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = local_58;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       uStack_50;
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)
               &local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkFence)local_88.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                        m_internal);
  }
  return;
}

Assistant:

CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance (Context& context, TestParams testParams)
	: vkt::TestInstance	(context)
	, m_params			(testParams)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				vkDevice			= context.getDevice();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	// Create command pool
	m_cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Create command buffer
	m_cmdBuffer = allocateCommandBuffer(vk, vkDevice, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	m_fence = createFence(vk, vkDevice);
}